

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::start(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
        *this,environment_t *env)

{
  outliving_reference_t<so_5::stats::repository_t> local_20;
  
  std::mutex::lock(&this->m_lock);
  local_20.m_ptr = environment_t::stats_repository(env);
  stats::manually_registered_source_t::start
            (&(this->m_data_source).super_manually_registered_source_t,&local_20);
  details::
  do_with_rollback_on_exception<so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>::start(so_5::environment_t&)::_lambda()_1_,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>::start(so_5::environment_t&)::_lambda()_2_>
            ((anon_class_8_1_8991fb9c)this,(anon_class_8_1_8991fb9c)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void
		start( so_5::environment_t & env ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				m_data_source.start( outliving_mutable(env.stats_repository()) );

				so_5::details::do_with_rollback_on_exception(
					[this] {
						// do_with_rollback_on_exception is used in this simple case
						// just for simplification of extension of that block
						// in the future.
						m_shutdown_started = false;
					},
					[this] { m_data_source.stop(); } );
			}